

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O0

stb_vorbis * stb_vorbis_open_memory(uchar *data,int len,int *error,stb_vorbis_alloc *alloc)

{
  int iVar1;
  undefined4 *in_RDX;
  long in_RDI;
  stb_vorbis p;
  stb_vorbis *f;
  stb_vorbis_alloc *in_stack_fffffffffffff858;
  stb_vorbis *in_stack_fffffffffffff860;
  stb_vorbis *in_stack_fffffffffffff880;
  undefined4 local_704;
  vorb *in_stack_fffffffffffffdd8;
  stb_vorbis *local_8;
  
  if (in_RDI == 0) {
    if (in_RDX != (undefined4 *)0x0) {
      *in_RDX = 10;
    }
    local_8 = (stb_vorbis *)0x0;
  }
  else {
    vorbis_init(in_stack_fffffffffffff860,in_stack_fffffffffffff858);
    iVar1 = start_decoder(in_stack_fffffffffffffdd8);
    if ((iVar1 == 0) ||
       (local_8 = vorbis_alloc(in_stack_fffffffffffff860), local_8 == (stb_vorbis *)0x0)) {
      if (in_RDX != (undefined4 *)0x0) {
        *in_RDX = local_704;
      }
      vorbis_deinit(in_stack_fffffffffffff880);
      local_8 = (stb_vorbis *)0x0;
    }
    else {
      memcpy(local_8,&stack0xfffffffffffff860,0x770);
      vorbis_pump_first_frame(in_stack_fffffffffffff860);
      if (in_RDX != (undefined4 *)0x0) {
        *in_RDX = 0;
      }
    }
  }
  return local_8;
}

Assistant:

stb_vorbis * stb_vorbis_open_memory(const unsigned char *data, int len, int *error, const stb_vorbis_alloc *alloc)
{
   stb_vorbis *f, p;
   if (!data) {
      if (error) *error = VORBIS_unexpected_eof;
      return NULL;
   }
   vorbis_init(&p, alloc);
   p.stream = (uint8 *) data;
   p.stream_end = (uint8 *) data + len;
   p.stream_start = (uint8 *) p.stream;
   p.stream_len = len;
   p.push_mode = FALSE;
   if (start_decoder(&p)) {
      f = vorbis_alloc(&p);
      if (f) {
         *f = p;
         vorbis_pump_first_frame(f);
         if (error) *error = VORBIS__no_error;
         return f;
      }
   }
   if (error) *error = p.error;
   vorbis_deinit(&p);
   return NULL;
}